

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewLogger(PosixEnv *this,string *fname,Logger **result)

{
  char *__filename;
  FILE *f_00;
  int *piVar1;
  PosixLogger *this_00;
  undefined8 *in_RCX;
  FILE *f;
  Logger **result_local;
  string *fname_local;
  PosixEnv *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  f_00 = fopen(__filename,"w");
  if (f_00 == (FILE *)0x0) {
    *in_RCX = 0;
    piVar1 = __errno_location();
    IOError((anon_unknown_1 *)this,(string *)result,*piVar1);
  }
  else {
    this_00 = (PosixLogger *)operator_new(0x18);
    PosixLogger::PosixLogger(this_00,(FILE *)f_00,gettid);
    *in_RCX = this_00;
    Status::OK();
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status NewLogger(const std::string &fname, Logger **result) {
                FILE *f = fopen(fname.c_str(), "w");
                if (f == NULL) {
                    *result = NULL;
                    return IOError(fname, errno);
                } else {
                    *result = new PosixLogger(f, &PosixEnv::gettid);
                    return Status::OK();
                }
            }